

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * CEPlanet::Venus(void)

{
  CEPlanet *in_RDI;
  CEPlanet *venus;
  CEPlanet *angle;
  CEPlanet *this;
  uint in_stack_ffffffffffffff80;
  CEAngle *ycoord;
  CEAngle *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  CEPlanet *this_00;
  undefined1 local_31 [40];
  undefined1 local_9;
  
  local_9 = CIRS;
  this = (CEPlanet *)local_31;
  angle = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Venus",(allocator *)this);
  this_00 = (CEPlanet *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  ycoord = (CEAngle *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  CEPlanet(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,ycoord,
           (CESkyCoordType *)(ulong)in_stack_ffffffffffffff80);
  CEAngle::~CEAngle((CEAngle *)0x13b781);
  CEAngle::~CEAngle((CEAngle *)0x13b78b);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  SetSemiMajorAxis_AU(this,(double)angle,(double)in_RDI);
  SetEccentricity(in_RDI,0.00676399,-5.107e-05);
  SetInclination(in_RDI,3.39777545,0.00043494,DEGREES);
  SetMeanLongitude(in_RDI,181.9797085,58517.8156026,DEGREES);
  SetPerihelionLongitude(in_RDI,131.76755713,0.05679648,DEGREES);
  SetAscendingNodeLongitude(in_RDI,76.67261496,-0.27274174,DEGREES);
  SetMeanRadius_m(in_RDI,6051800.0);
  SetAlbedo(in_RDI,0.65);
  SetMass_kg(in_RDI,4.8685e+24);
  SetSofaID(this,(double *)angle);
  return angle;
}

Assistant:

CEPlanet CEPlanet::Venus()
{
    CEPlanet venus("Venus", 0.0, 0.0) ;
    venus.SetSemiMajorAxis_AU(0.72332102, -0.00000026) ;
    venus.SetEccentricity(0.00676399, -0.00005107) ;
    venus.SetInclination(3.39777545, 0.00043494, CEAngleType::DEGREES) ;
    venus.SetMeanLongitude(181.97970850, 58517.81560260, CEAngleType::DEGREES) ;
    venus.SetPerihelionLongitude(131.76755713, 0.05679648, CEAngleType::DEGREES) ;
    venus.SetAscendingNodeLongitude(76.67261496, -0.27274174, CEAngleType::DEGREES) ;
    
    // Set the planetary properties
    venus.SetMeanRadius_m(6051800.0) ;
    venus.SetAlbedo(0.65) ;
    venus.SetMass_kg(48.685E23) ;
    
    // Set the sofa planet ID
    venus.SetSofaID(2) ;
    
    return venus ;
}